

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(void)

{
  undefined8 this;
  int iVar1;
  long *plVar2;
  ostream *poVar3;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *__x;
  long lVar4;
  shared_ptr<Population> *population;
  pointer psVar5;
  int kI;
  long lVar6;
  shared_ptr<Population> p;
  CellTypeDirector director;
  shared_ptr<CellTypeJSONRepresentationBuilder> jsonBuilder;
  shared_ptr<CellTypeBuilder> builder;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> populations;
  Player player;
  PopulationDirector d;
  json waterCell;
  shared_ptr<CellType> steppeCell;
  Map map;
  Population *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  undefined8 local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_130;
  CellTypeJSONRepresentationBuilder *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  CellTypeBuilder *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  undefined1 local_108 [32];
  undefined1 local_e8 [24];
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  HerbivorePopulationBuilder *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  CellTypeJSONRepresentationBuilder *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  CellTypeBuilder *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_68;
  CellType *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Map local_48 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***Create cell example code***",0x1e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  local_138 = 0;
  p_Stack_130 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118 = (CellTypeBuilder *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CellTypeBuilder,std::allocator<CellTypeBuilder>>
            (&local_110,&local_118,(allocator<CellTypeBuilder> *)local_e8);
  local_78 = local_118;
  local_70 = local_110._M_pi;
  if (local_110._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_110._M_pi)->_M_use_count = (local_110._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_110._M_pi)->_M_use_count = (local_110._M_pi)->_M_use_count + 1;
    }
  }
  CellTypeDirector::setBuilder(&local_138,&local_78);
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  CellTypeDirector::makeSteppeCell();
  CellTypeBuilder::getProduct();
  plVar2 = (long *)operator<<((ostream *)&std::cout,local_58);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  local_128 = (CellTypeJSONRepresentationBuilder *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CellTypeJSONRepresentationBuilder,std::allocator<CellTypeJSONRepresentationBuilder>>
            (&local_120,&local_128,(allocator<CellTypeJSONRepresentationBuilder> *)local_e8);
  local_88 = local_128;
  local_80 = local_120._M_pi;
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_120._M_pi)->_M_use_count = (local_120._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_120._M_pi)->_M_use_count = (local_120._M_pi)->_M_use_count + 1;
    }
  }
  CellTypeDirector::setBuilder(&local_138,&local_88);
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  CellTypeDirector::makeWaterCell();
  CellTypeJSONRepresentationBuilder::getProduct_abi_cxx11_();
  poVar3 = nlohmann::operator<<((ostream *)&std::cout,&local_68);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***Create population example code***",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  local_a8 = 0;
  p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8._0_8_ = (HerbivorePopulationBuilder *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<HerbivorePopulationBuilder,std::allocator<HerbivorePopulationBuilder>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8),
             (HerbivorePopulationBuilder **)local_e8,
             (allocator<HerbivorePopulationBuilder> *)local_108);
  this = local_e8._8_8_;
  local_98 = (HerbivorePopulationBuilder *)local_e8._0_8_;
  local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_e8._8_8_ + 8) = *(_Atomic_word *)(local_e8._8_8_ + 8) + 1;
    }
  }
  PopulationDirector::setBuilder(&local_a8,&local_98);
  if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
  }
  local_e8._0_8_ = (HerbivorePopulationBuilder *)(local_e8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"elephant","");
  PopulationDirector::makeBig((string *)&local_148);
  if ((HerbivorePopulationBuilder *)local_e8._0_8_ !=
      (HerbivorePopulationBuilder *)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_,
                    (ulong)((long)&((__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *)
                                   local_e8._16_8_)->_M_ptr + 1));
  }
  operator<<((ostream *)&std::cout,local_148);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***Mutation example code***",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  Population::mutate((MutationType)local_148);
  operator<<((ostream *)&std::cout,local_148);
  Population::mutate((MutationType)local_148);
  operator<<((ostream *)&std::cout,local_148);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***Generate map example code***",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  Map::Map(local_48,10,10);
  Map::generate();
  lVar6 = 0;
  do {
    lVar4 = 0;
    do {
      Map::operator[]((ulong)local_48);
      iVar1 = CellType::getType();
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0xa0);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"***Generate player example code***",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  local_e8._0_8_ = (HerbivorePopulationBuilder *)0x0;
  local_e8._8_8_ = (pointer)0x0;
  local_e8._16_8_ = (pointer)0x0;
  local_c8 = 0;
  local_c0 = 0;
  local_108._0_8_ = (pointer)(local_108 + 0x10);
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Cat","");
  Player::SetName((string *)local_e8);
  if ((pointer)local_108._0_8_ != (pointer)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_,
                    (ulong)((long)&((__shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2> *)
                                   local_108._16_8_)->_M_ptr + 1));
  }
  Player::generatePopulations();
  __x = (vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *)
        Player::GetPlayerPopulations();
  std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::vector
            ((vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *)
             local_108,__x);
  for (psVar5 = (pointer)local_108._0_8_; psVar5 != (pointer)local_108._8_8_; psVar5 = psVar5 + 1) {
    plVar2 = (long *)operator<<((ostream *)&std::cout,
                                (psVar5->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::~vector
            ((vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *)
             local_108);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>::~vector
            ((vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *)
             local_e8);
  std::
  vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
  ::~vector((vector<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>,_std::allocator<std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>_>_>
             *)local_48);
  if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_68);
  if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_110._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110._M_pi);
  }
  if (p_Stack_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_130);
  }
  return 0;
}

Assistant:

int main() {
  std::cout << "***Create cell example code***" << std:: endl;

  CellTypeDirector director;

  auto builder = std::make_shared<CellTypeBuilder>();
  director.setBuilder(builder);
  director.makeSteppeCell();
  std::shared_ptr<CellType> steppeCell = builder -> getProduct();
  std::cout << *steppeCell << std::endl;

  auto jsonBuilder = std::make_shared<CellTypeJSONRepresentationBuilder>();
  director.setBuilder(jsonBuilder);
  director.makeWaterCell();
  auto waterCell = jsonBuilder -> getProduct();
  std::cout << waterCell << std::endl;


  std::cout << "***Create population example code***" << std:: endl;
  PopulationDirector d;
  std::shared_ptr<PopulationBuilder> b = std::make_shared<HerbivorePopulationBuilder>();
  d.setBuilder(b);
  std::shared_ptr<Population> p = d.makeBig("elephant");
  std::cout << *p;

  std::cout << "***Mutation example code***" << std::endl;
  p->mutate(Population::MutationType::VELOCITY);
  std::cout << *p;
  p->mutate(Population::MutationType::SIZE);
  std::cout << *p;

  std::cout << "***Generate map example code***" << std::endl;
  Map map(10, 10);
  map.generate();
  for (int kI = 0; kI < 10; ++kI) {
    for (int kJ = 0; kJ < 10; ++kJ) {
      std::cout << map[kI][kJ] -> getType() << " ";
    }
    std::cout << std::endl;
  }

  std::cout << "***Generate player example code***" << std::endl;
  Player player;
  player.SetName("Cat");
  player.generatePopulations();
  auto populations = player.GetPlayerPopulations();
  for (auto &population : populations) {
    std::cout << *population << std::endl;
  }

  return 0;
}